

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

string_t duckdb::NumericHelper::FormatSigned<signed_char>(char value,Vector *vector)

{
  uint8_t value_00;
  int iVar1;
  char *pcVar2;
  idx_t len;
  byte bVar3;
  Vector *vector_00;
  string_t result;
  anon_union_16_2_67f50693_for_value local_30;
  
  bVar3 = -(value >> 7);
  value_00 = (value >> 7 ^ value) + bVar3;
  iVar1 = UnsignedLength<unsigned_char>(value_00);
  vector_00 = (Vector *)(long)(int)((uint)bVar3 + iVar1);
  local_30.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString((StringVector *)vector,vector_00,len);
  pcVar2 = local_30.pointer.prefix;
  if (0xc < local_30._0_4_) {
    pcVar2 = local_30._8_8_;
  }
  pcVar2 = FormatUnsigned<unsigned_char>(value_00,pcVar2 + (long)vector_00);
  if (value < '\0') {
    pcVar2[-1] = '-';
  }
  string_t::Finalize((string_t *)&local_30.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_30.pointer;
}

Assistant:

static string_t FormatSigned(T value, Vector &vector) {
		typedef typename MakeUnsigned<T>::type unsigned_t;
		int8_t sign = -(value < 0);
		unsigned_t unsigned_value = unsigned_t(value ^ T(sign)) + unsigned_t(AbsValue(sign));
		auto length = UnsafeNumericCast<idx_t>(UnsignedLength<unsigned_t>(unsigned_value) + AbsValue(sign));
		string_t result = StringVector::EmptyString(vector, length);
		auto dataptr = result.GetDataWriteable();
		auto endptr = dataptr + length;
		endptr = FormatUnsigned(unsigned_value, endptr);
		if (sign) {
			*--endptr = '-';
		}
		result.Finalize();
		return result;
	}